

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_object.cpp
# Opt level: O0

int __thiscall booster::shared_object::open(shared_object *this,char *__file,int __oflag,...)

{
  undefined8 uVar1;
  void *pvVar2;
  data *pdVar3;
  char *pcVar4;
  uint in_ECX;
  bool bVar5;
  int dlflags;
  uint local_28;
  
  close(this,(int)__file);
  local_28 = (uint)((in_ECX & 1) != 0);
  if ((in_ECX & 2) != 0) {
    local_28 = local_28 | 2;
  }
  if ((in_ECX & 4) != 0) {
    local_28 = local_28 | 0x100;
  }
  uVar1 = std::__cxx11::string::c_str();
  pvVar2 = (void *)dlopen(uVar1,local_28);
  pdVar3 = hold_ptr<booster::shared_object::data>::operator->(&this->d);
  pdVar3->handle = pvVar2;
  pdVar3 = hold_ptr<booster::shared_object::data>::operator->(&this->d);
  bVar5 = pdVar3->handle != (void *)0x0;
  if (!bVar5) {
    pcVar4 = (char *)dlerror();
    pdVar3 = (data *)std::__cxx11::string::operator=(___oflag,pcVar4);
  }
  return (int)CONCAT71((int7)((ulong)pdVar3 >> 8),bVar5);
}

Assistant:

bool shared_object::open(std::string const &file_name,std::string &error_message,int flags)
	{
		close();
		int dlflags = 0;
		if(flags & load_lazy)
			dlflags |= RTLD_LAZY;
		if(flags & load_now)
			dlflags |= RTLD_NOW;
		if(flags & load_global)
			dlflags |= RTLD_GLOBAL;
		if(flags & load_local)
			dlflags |= RTLD_LOCAL;
		d->handle = dlopen(file_name.c_str(),dlflags);
		if(!d->handle) {
			error_message = dlerror();
			return false;
		}
		return true;
	}